

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<unsigned_char,unsigned_long>(void)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  undefined7 uStack_58;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  unsigned_long u;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_41;
  ulong local_40;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  
  u = 0;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_long>(&local_41,&u);
  su.m_int = u;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_long>(&st2,&su);
  local_41.m_int = '\0';
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &local_41,&u);
  if (su.m_int < 0x100) {
    local_41.m_int = st2.m_int;
    SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_41,u);
    if ((char)((ushort)((ushort)local_41.m_int * (ushort)st2.m_int) >> 8) == '\0') {
      operator*(u,local_41);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,su);
      u = 1;
      local_40._0_4_ = 1;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,(int *)&local_40);
      local_40._0_4_ = 1;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
                 (int *)&local_40);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      local_40._0_4_ = 1;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2
                 ,(int *)&local_40);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                (&local_41,st2);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,su);
      u = 1;
      local_40._0_4_ = 1;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2
                 ,(int *)&local_40);
      local_40._0_4_ = 1;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,(int *)&local_40);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                (&local_41,st2);
      operator/(u,local_41);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,su);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                (&local_41,st2);
      operator+(u,local_41);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,su);
      local_40._0_4_ = 0;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,(int *)&local_40);
      u = 0;
      local_40._0_4_ = 0;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2
                 ,(int *)&local_40);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                (&local_41,st2);
      operator-(CONCAT17(st2.m_int,uStack_58),
                (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      local_40._0_4_ = 1;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,(int *)&local_40);
      local_40._0_4_ = 1;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
                 (int *)&local_40);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,su);
      u = 1;
      local_40 = CONCAT44(local_40._4_4_,1);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
                 (int *)&local_40);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SVar1 = SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::
              operator<<((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_41,su);
      operator<<(SVar1.m_int,su);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,su);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SVar1 = SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::
              operator>>((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_41,su);
      operator>>(SVar1.m_int,su);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_41,su);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
                (&local_41,st2);
      local_40 = (ulong)((local_41.m_int & (byte)u) & (uint)su.m_int);
      SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_40);
      local_41.m_int = (byte)u & (byte)su.m_int & local_41.m_int & st2.m_int;
      local_40 = u & 0xff | su.m_int;
      SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_40);
      local_41.m_int = (byte)su.m_int | (byte)u | local_41.m_int | st2.m_int;
      local_40 = (local_41.m_int ^ (byte)u) ^ su.m_int;
      SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_40);
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}